

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

Result<wallet::SelectionResult> *
wallet::AutomaticCoinSelection
          (Result<wallet::SelectionResult> *__return_storage_ptr__,CWallet *wallet,
          CoinsResult *available_coins,CAmount *value_to_select,
          CoinSelectionParams *coin_selection_params)

{
  long lVar1;
  pointer pOVar2;
  bool bVar3;
  Chain *pCVar4;
  size_t sVar5;
  CAmount CVar6;
  CAmount CVar7;
  iterator iVar8;
  uint uVar9;
  pointer __k;
  bilingual_str *this;
  long lVar11;
  uint uVar12;
  long lVar14;
  OutputGroup *group;
  pointer this_00;
  long in_FS_OFFSET;
  initializer_list<wallet::SelectionFilter> __l;
  vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
  res_detailed_errors;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> discarded_groups;
  vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> ordered_filters;
  uint limit_descendant_count;
  uint limit_ancestor_count;
  bilingual_str local_148;
  bilingual_str local_108;
  bilingual_str local_c8;
  FilteredOutputGroups filtered_groups;
  ulong uVar10;
  ulong uVar13;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  limit_ancestor_count = 0;
  limit_descendant_count = 0;
  pCVar4 = CWallet::chain(wallet);
  (**(code **)(*(long *)pCVar4 + 200))(pCVar4,&limit_ancestor_count,&limit_descendant_count);
  uVar9 = limit_ancestor_count + (limit_ancestor_count == 0);
  uVar10 = (ulong)uVar9;
  uVar12 = limit_descendant_count + (limit_descendant_count == 0);
  uVar13 = (ulong)uVar12;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filtered_groups,"-walletrejectlongchains",
             (allocator<char> *)&ordered_filters);
  bVar3 = ArgsManager::GetBoolArg(&gArgs,(string *)&filtered_groups,true);
  std::__cxx11::string::~string((string *)&filtered_groups);
  if (coin_selection_params->m_avoid_partial_spends == true) {
    sVar5 = CoinsResult::Size(available_coins);
    if (100 < sVar5) {
      CoinsResult::Shuffle(available_coins,coin_selection_params->rng_fast);
    }
  }
  filtered_groups._M_t._M_impl._0_8_ = 0x600000001;
  filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = 0;
  filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = 0;
  filtered_groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x100000001;
  __l._M_len = 2;
  __l._M_array = (iterator)&filtered_groups;
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
            (&ordered_filters,__l,(allocator_type *)&discarded_groups);
  if (wallet->m_spend_zero_conf_change == true) {
    filtered_groups._M_t._M_impl._0_8_ = 0x100000000;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x2;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = 0;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = 1;
    std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
    emplace_back<wallet::SelectionFilter>(&ordered_filters,(SelectionFilter *)&filtered_groups);
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (_Base_ptr)(uVar10 / 3);
    if (3 < (uint)(_Base_ptr)(uVar10 / 3)) {
      filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (_Base_ptr)0x4;
    }
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x4;
    if ((uint)(_Base_ptr)(uVar13 / 3) < 4) {
      filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)(uVar13 / 3);
    }
    filtered_groups._M_t._M_impl._0_8_ = 0x100000000;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = 0;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = 1;
    std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
    emplace_back<wallet::SelectionFilter>(&ordered_filters,(SelectionFilter *)&filtered_groups);
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = uVar9 >> 1;
    filtered_groups._M_t._M_impl._0_8_ = 0x100000000;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = uVar12 >> 1;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = 0;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = 1;
    std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
    emplace_back<wallet::SelectionFilter>(&ordered_filters,(SelectionFilter *)&filtered_groups);
    filtered_groups._M_t._M_impl._0_8_ = 0x100000000;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)(uVar13 - 1)
    ;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uVar10 - 1;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = 1;
    filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = 1;
    std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
    emplace_back<wallet::SelectionFilter>(&ordered_filters,(SelectionFilter *)&filtered_groups);
    if (coin_selection_params->m_include_unsafe_inputs == true) {
      filtered_groups._M_t._M_impl._0_8_ = 0;
      filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = 1;
      filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = 1;
      std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
      emplace_back<wallet::SelectionFilter>(&ordered_filters,(SelectionFilter *)&filtered_groups);
    }
    if (!bVar3) {
      filtered_groups._M_t._M_impl._0_8_ = 0x100000000;
      filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0xffffffff;
      filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = 0xffffffffffffffff;
      filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0xffffffff;
      filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = 1;
      filtered_groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_1_ = 1;
      std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
      emplace_back<wallet::SelectionFilter>(&ordered_filters,(SelectionFilter *)&filtered_groups);
    }
  }
  discarded_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  discarded_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  discarded_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GroupOutputs(&filtered_groups,wallet,available_coins,coin_selection_params,&ordered_filters,
               &discarded_groups);
  pOVar2 = discarded_groups.
           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar11 = 0;
  lVar14 = 0;
  for (this_00 = discarded_groups.
                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pOVar2; this_00 = this_00 + 1)
  {
    CVar6 = OutputGroup::GetSelectionAmount(this_00);
    if ((uVar10 <= this_00->m_ancestors) || (uVar13 <= this_00->m_descendants)) {
      CVar7 = OutputGroup::GetSelectionAmount(this_00);
      lVar11 = lVar11 + CVar7;
    }
    lVar14 = lVar14 + CVar6;
  }
  if (available_coins->total_amount - lVar14 < *value_to_select) {
    if (lVar11 < *value_to_select) {
      local_108.original._M_dataplus._M_p = (pointer)&local_108.original.field_2;
      local_108.original._M_string_length = 0;
      local_108.original.field_2._M_local_buf[0] = '\0';
      local_108.translated._M_dataplus._M_p = (pointer)&local_108.translated.field_2;
      local_108.translated._M_string_length = 0;
      local_108.translated.field_2._M_local_buf[0] = '\0';
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                 __return_storage_ptr__,&local_108);
      this = &local_108;
    }
    else {
      _(&local_c8,(ConstevalStringLiteral)0x3ffcf8);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                 __return_storage_ptr__,&local_c8);
      this = &local_c8;
    }
    bilingual_str::~bilingual_str(this);
  }
  else {
    res_detailed_errors.
    super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    res_detailed_errors.
    super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    res_detailed_errors.
    super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (__k = ordered_filters.
               super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
               ._M_impl.super__Vector_impl_data._M_start;
        __k != ordered_filters.
               super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
               ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
      iVar8 = std::
              _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
              ::find(&filtered_groups._M_t,&__k->filter);
      if ((_Rb_tree_header *)iVar8._M_node != &filtered_groups._M_t._M_impl.super__Rb_tree_header) {
        pCVar4 = CWallet::chain(wallet);
        AttemptSelection(__return_storage_ptr__,pCVar4,value_to_select,
                         (OutputGroupTypeMap *)(iVar8._M_node + 2),coin_selection_params,
                         __k->allow_mixed_output_types);
        if (*(__index_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) ==
            '\x01') goto LAB_00215427;
        bVar3 = HasErrorMsg(__return_storage_ptr__);
        if (bVar3) {
          std::
          vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
          ::emplace_back<util::Result<wallet::SelectionResult>>
                    ((vector<util::Result<wallet::SelectionResult>,std::allocator<util::Result<wallet::SelectionResult>>>
                      *)&res_detailed_errors,__return_storage_ptr__);
        }
        std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
        ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                          __return_storage_ptr__);
      }
    }
    if (res_detailed_errors.
        super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        res_detailed_errors.
        super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_148.original._M_dataplus._M_p = (pointer)&local_148.original.field_2;
      local_148.original._M_string_length = 0;
      local_148.original.field_2._M_local_buf[0] = '\0';
      local_148.translated._M_dataplus._M_p = (pointer)&local_148.translated.field_2;
      local_148.translated._M_string_length = 0;
      local_148.translated.field_2._M_local_buf[0] = '\0';
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                 __return_storage_ptr__,&local_148);
      bilingual_str::~bilingual_str(&local_148);
    }
    else {
      std::__detail::__variant::_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult>::
      _Move_ctor_base((_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                      __return_storage_ptr__,
                      (_Move_ctor_base<false,_bilingual_str,_wallet::SelectionResult> *)
                      res_detailed_errors.
                      super__Vector_base<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
LAB_00215427:
    std::
    vector<util::Result<wallet::SelectionResult>,_std::allocator<util::Result<wallet::SelectionResult>_>_>
    ::~vector(&res_detailed_errors);
  }
  std::
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::~_Rb_tree(&filtered_groups._M_t);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector(&discarded_groups)
  ;
  std::_Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
  ~_Vector_base(&ordered_filters.
                 super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
               );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> AutomaticCoinSelection(const CWallet& wallet, CoinsResult& available_coins, const CAmount& value_to_select, const CoinSelectionParams& coin_selection_params)
{
    unsigned int limit_ancestor_count = 0;
    unsigned int limit_descendant_count = 0;
    wallet.chain().getPackageLimits(limit_ancestor_count, limit_descendant_count);
    const size_t max_ancestors = (size_t)std::max<int64_t>(1, limit_ancestor_count);
    const size_t max_descendants = (size_t)std::max<int64_t>(1, limit_descendant_count);
    const bool fRejectLongChains = gArgs.GetBoolArg("-walletrejectlongchains", DEFAULT_WALLET_REJECT_LONG_CHAINS);

    // Cases where we have 101+ outputs all pointing to the same destination may result in
    // privacy leaks as they will potentially be deterministically sorted. We solve that by
    // explicitly shuffling the outputs before processing
    if (coin_selection_params.m_avoid_partial_spends && available_coins.Size() > OUTPUT_GROUP_MAX_ENTRIES) {
        available_coins.Shuffle(coin_selection_params.rng_fast);
    }

    // Coin Selection attempts to select inputs from a pool of eligible UTXOs to fund the
    // transaction at a target feerate. If an attempt fails, more attempts may be made using a more
    // permissive CoinEligibilityFilter.
    {
        // Place coins eligibility filters on a scope increasing order.
        std::vector<SelectionFilter> ordered_filters{
                // If possible, fund the transaction with confirmed UTXOs only. Prefer at least six
                // confirmations on outputs received from other wallets and only spend confirmed change.
                {CoinEligibilityFilter(1, 6, 0), /*allow_mixed_output_types=*/false},
                {CoinEligibilityFilter(1, 1, 0)},
        };
        // Fall back to using zero confirmation change (but with as few ancestors in the mempool as
        // possible) if we cannot fund the transaction otherwise.
        if (wallet.m_spend_zero_conf_change) {
            ordered_filters.push_back({CoinEligibilityFilter(0, 1, 2)});
            ordered_filters.push_back({CoinEligibilityFilter(0, 1, std::min(size_t{4}, max_ancestors/3), std::min(size_t{4}, max_descendants/3))});
            ordered_filters.push_back({CoinEligibilityFilter(0, 1, max_ancestors/2, max_descendants/2)});
            // If partial groups are allowed, relax the requirement of spending OutputGroups (groups
            // of UTXOs sent to the same address, which are obviously controlled by a single wallet)
            // in their entirety.
            ordered_filters.push_back({CoinEligibilityFilter(0, 1, max_ancestors-1, max_descendants-1, /*include_partial=*/true)});
            // Try with unsafe inputs if they are allowed. This may spend unconfirmed outputs
            // received from other wallets.
            if (coin_selection_params.m_include_unsafe_inputs) {
                ordered_filters.push_back({CoinEligibilityFilter(/*conf_mine=*/0, /*conf_theirs*/0, max_ancestors-1, max_descendants-1, /*include_partial=*/true)});
            }
            // Try with unlimited ancestors/descendants. The transaction will still need to meet
            // mempool ancestor/descendant policy to be accepted to mempool and broadcasted, but
            // OutputGroups use heuristics that may overestimate ancestor/descendant counts.
            if (!fRejectLongChains) {
                ordered_filters.push_back({CoinEligibilityFilter(0, 1, std::numeric_limits<uint64_t>::max(),
                                                                   std::numeric_limits<uint64_t>::max(),
                                                                   /*include_partial=*/true)});
            }
        }

        // Group outputs and map them by coin eligibility filter
        std::vector<OutputGroup> discarded_groups;
        FilteredOutputGroups filtered_groups = GroupOutputs(wallet, available_coins, coin_selection_params, ordered_filters, discarded_groups);

        // Check if we still have enough balance after applying filters (some coins might be discarded)
        CAmount total_discarded = 0;
        CAmount total_unconf_long_chain = 0;
        for (const auto& group : discarded_groups) {
            total_discarded += group.GetSelectionAmount();
            if (group.m_ancestors >= max_ancestors || group.m_descendants >= max_descendants) total_unconf_long_chain += group.GetSelectionAmount();
        }

        if (CAmount total_amount = available_coins.GetTotalAmount() - total_discarded < value_to_select) {
            // Special case, too-long-mempool cluster.
            if (total_amount + total_unconf_long_chain > value_to_select) {
                return util::Error{_("Unconfirmed UTXOs are available, but spending them creates a chain of transactions that will be rejected by the mempool")};
            }
            return util::Error{}; // General "Insufficient Funds"
        }

        // Walk-through the filters until the solution gets found.
        // If no solution is found, return the first detailed error (if any).
        // future: add "error level" so the worst one can be picked instead.
        std::vector<util::Result<SelectionResult>> res_detailed_errors;
        for (const auto& select_filter : ordered_filters) {
            auto it = filtered_groups.find(select_filter.filter);
            if (it == filtered_groups.end()) continue;
            if (auto res{AttemptSelection(wallet.chain(), value_to_select, it->second,
                                          coin_selection_params, select_filter.allow_mixed_output_types)}) {
                return res; // result found
            } else {
                // If any specific error message appears here, then something particularly wrong might have happened.
                // Save the error and continue the selection process. So if no solutions gets found, we can return
                // the detailed error to the upper layers.
                if (HasErrorMsg(res)) res_detailed_errors.emplace_back(std::move(res));
            }
        }

        // Return right away if we have a detailed error
        if (!res_detailed_errors.empty()) return std::move(res_detailed_errors.front());


        // General "Insufficient Funds"
        return util::Error{};
    }
}